

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void partial_suite::parse_string(void)

{
  bool v;
  reader *reader_00;
  type local_1f0;
  undefined1 local_1c8 [8];
  basic_variable<std::allocator<char>_> result;
  undefined1 local_188 [8];
  reader reader;
  allocator<char> local_29;
  string local_28 [8];
  string input;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_28,"\"alpha\"",&local_29);
  std::allocator<char>::~allocator(&local_29);
  result.storage._40_8_ = std::__cxx11::string::operator_cast_to_basic_string_view(local_28);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_188,(view_type *)&result.storage.field_0x28);
  trial::protocol::json::partial::parse<std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_1c8,(partial *)local_188,reader_00);
  v = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string>
                ((basic_variable<std::allocator<char>> *)local_1c8);
  boost::detail::test_impl
            ("result.is<std::string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x1bc,"void partial_suite::parse_string()",v);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::string>
            (&local_1f0,(basic_variable<std::allocator<char>> *)local_1c8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result.value<std::string>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x1bd,"void partial_suite::parse_string()",&local_1f0,"alpha");
  std::__cxx11::string::~string((string *)&local_1f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1c8);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_188);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void parse_string()
{
    std::string input = "\"alpha\"";
    json::reader reader(input);
    auto result = json::partial::parse(reader);
    TRIAL_PROTOCOL_TEST(result.is<std::string>());
    TRIAL_PROTOCOL_TEST_EQUAL(result.value<std::string>(), "alpha");
}